

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::init_tree(memory_tree *b)

{
  node *pnVar1;
  size_t sVar2;
  example *peVar3;
  ostream *poVar4;
  long *plVar5;
  node local_58;
  
  b->iter = 0;
  b->routers_used = 0;
  b->test_mode = false;
  b->max_depth = 0;
  b->max_ex_in_leaf = 0;
  *(undefined8 *)((long)&b->max_ex_in_leaf + 4) = 0;
  b->test_time = 0.0;
  b->num_mistakes = 0;
  b->top_K = 1;
  b->F1_score = 0.0;
  b->hamming_loss = 0.0;
  local_58.left = 0;
  local_58.right = 0;
  local_58.parent = 0;
  local_58.internal = 0;
  local_58.depth = 0;
  local_58.base_router = 0;
  local_58.nl = 0.001;
  local_58.nr = 0.001;
  local_58.examples_index._begin = (uint *)0x0;
  local_58.examples_index._end = (uint *)0x0;
  local_58.examples_index.end_array = (uint *)0x0;
  local_58.examples_index.erase_count = 0;
  v_array<memory_tree_ns::node>::push_back(&b->nodes,&local_58);
  ((b->nodes)._begin)->internal = -1;
  pnVar1 = (b->nodes)._begin;
  sVar2 = b->routers_used;
  b->routers_used = sVar2 + 1;
  pnVar1->base_router = (uint32_t)sVar2;
  peVar3 = calloc_or_throw<example>(1);
  b->kprod_ec = peVar3;
  b->total_num_queries = 0;
  b->max_routers = b->max_nodes;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"tree initiazliation is done....",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"max nodes ",10);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"tree size: ",0xb);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"max number of unique labels: ",0x1d);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"learn at leaf: ",0xf);
  plVar5 = (long *)std::ostream::operator<<(poVar4,b->learn_at_leaf);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"num of dream operations per example: ",0x25);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"current_pass: ",0xe);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"oas: ",5);
  plVar5 = (long *)std::ostream::operator<<(poVar4,b->oas);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return;
}

Assistant:

void init_tree(memory_tree& b)
    {
        //srand48(4000);
        //simple initilization: initilize the root only
        b.iter = 0;
        b.num_mistakes = 0;
        b.routers_used = 0;
        b.test_mode = false;
        b.max_depth = 0;
        b.max_ex_in_leaf = 0;
        b.construct_time = 0;
        b.test_time = 0;
        b.top_K = 1;
        b.hamming_loss = 0.f;
        b.F1_score = 0.f;

        b.nodes.push_back(node());
        b.nodes[0].internal = -1; //mark the root as leaf
        b.nodes[0].base_router = (b.routers_used++);

        b.kprod_ec = &calloc_or_throw<example>(); //allocate space for kronecker product example

        b.total_num_queries = 0;
        b.max_routers = b.max_nodes;
        cout<<"tree initiazliation is done...."<<endl
            <<"max nodes "<<b.max_nodes<<endl
            <<"tree size: "<<b.nodes.size()<<endl
            <<"max number of unique labels: "<<b.max_num_labels<<endl
            <<"learn at leaf: "<<b.learn_at_leaf<<endl
            <<"num of dream operations per example: "<<b.dream_repeats<<endl
            <<"current_pass: "<<b.current_pass<<endl
            <<"oas: "<<b.oas<<endl;
    }